

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

int __thiscall QLabel::selectionStart(QLabel *this)

{
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  QWidgetTextControl local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = -1;
  if (*(long *)(*(long *)&(this->super_QFrame).super_QWidget.field_0x8 + 0x2f8) != 0) {
    QWidgetTextControl::textCursor(local_30);
    cVar1 = QTextCursor::hasSelection();
    QTextCursor::~QTextCursor((QTextCursor *)local_30);
    if (cVar1 != '\0') {
      QWidgetTextControl::textCursor(local_30);
      iVar2 = QTextCursor::selectionStart();
      QTextCursor::~QTextCursor((QTextCursor *)local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QLabel::selectionStart() const
{
    Q_D(const QLabel);
    if (d->control && d->control->textCursor().hasSelection())
        return d->control->textCursor().selectionStart();
    return -1;
}